

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Heap::Heap
          (Heap *this,uint gc_tune_min_objects,double gc_tune_growth_trigger)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined8 in_XMM0_Qa;
  
  *in_RDI = in_ESI;
  *(undefined8 *)(in_RDI + 2) = in_XMM0_Qa;
  *(undefined1 *)(in_RDI + 4) = 0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
            *)0x2233bb);
  *(undefined8 *)(in_RDI + 0xc) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  return;
}

Assistant:

Heap(unsigned gc_tune_min_objects, double gc_tune_growth_trigger)
        : gcTuneMinObjects(gc_tune_min_objects),
          gcTuneGrowthTrigger(gc_tune_growth_trigger),
          lastMark(0),
          lastNumEntities(0),
          numEntities(0)
    {
    }